

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::
Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>_>
::~Stack(Stack<std::unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>_>
         *this)

{
  long in_RDI;
  unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>
  *unaff_retaddr;
  unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>
  *p;
  long local_10;
  
  local_10 = *(long *)(in_RDI + 0x10);
  while (local_10 != *(long *)(in_RDI + 8)) {
    local_10 = local_10 + -8;
    std::
    unique_ptr<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>,_std::default_delete<Shell::Options::OptionValueConstraint<Shell::Options::IntroducedSymbolPrecedence>_>_>
    ::~unique_ptr(unaff_retaddr);
  }
  if (*(long *)(in_RDI + 8) != 0) {
    Lib::free(*(void **)(in_RDI + 8));
  }
  return;
}

Assistant:

inline ~Stack()
  {
    //The while cycle is completely eliminated by compiler
    //in "-O6 -DVDEBUG=0" mode for types without destructor,
    //so this destructor is constant time.
    C* p=_cursor;
    while(p!=_stack) {
      (--p)->~C();
    }
    if(_stack) {
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }
    else {
      ASS_EQ(_capacity,0);
    }
  }